

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AlterRenameTable(Parse *pParse,SrcList *pSrc,Token *pName)

{
  sqlite3 *db;
  Schema *pSVar1;
  int iVar2;
  Table *pTVar3;
  char *zName;
  Table *pTVar4;
  Index *pIVar5;
  Vdbe *p;
  Parse *pPVar6;
  undefined4 extraout_var;
  Schema **ppSVar7;
  char *pcVar8;
  int iDb;
  char *pcVar9;
  VTable *zP4;
  
  db = pParse->db;
  if (db->mallocFailed == '\0') {
    zName = (char *)0x0;
    pTVar3 = sqlite3LocateTableItem(pParse,0,pSrc->a);
    if (pTVar3 != (Table *)0x0) {
      if (pTVar3->pSchema == (Schema *)0x0) {
        iDb = -0x8000;
      }
      else {
        iDb = -1;
        ppSVar7 = &pParse->db->aDb->pSchema;
        do {
          iDb = iDb + 1;
          pSVar1 = *ppSVar7;
          ppSVar7 = ppSVar7 + 4;
        } while (pSVar1 != pTVar3->pSchema);
      }
      pcVar9 = db->aDb[iDb].zDbSName;
      zName = sqlite3NameFromToken(db,pName);
      if (zName == (char *)0x0) {
        zName = (char *)0x0;
      }
      else {
        pTVar4 = sqlite3FindTable(db,zName,pcVar9);
        if (((pTVar4 == (Table *)0x0) &&
            (pIVar5 = sqlite3FindIndex(db,zName,pcVar9), pIVar5 == (Index *)0x0)) &&
           (iVar2 = sqlite3IsShadowTableOf(db,pTVar3,zName), iVar2 == 0)) {
          iVar2 = isAlterableTable(pParse,pTVar3);
          if ((iVar2 != 0) ||
             (iVar2 = sqlite3CheckObjectName(pParse,zName,"table",zName), iVar2 != 0))
          goto LAB_001645be;
          pcVar8 = pTVar3->zName;
          if (pTVar3->eTabType != '\x02') {
            iVar2 = sqlite3AuthCheck(pParse,0x1a,pcVar9,pcVar8,(char *)0x0);
            if ((iVar2 == 0) && (iVar2 = sqlite3ViewGetColumnNames(pParse,pTVar3), iVar2 == 0)) {
              if (pTVar3->eTabType == '\x01') {
                for (zP4 = (pTVar3->u).vtab.p; (zP4 != (VTable *)0x0 && (zP4->db != db));
                    zP4 = zP4->pNext) {
                }
                if (zP4->pVtab->pModule->xRename == (_func_int_sqlite3_vtab_ptr_char_ptr *)0x0) {
                  zP4 = (VTable *)0x0;
                }
              }
              else {
                zP4 = (VTable *)0x0;
              }
              p = sqlite3GetVdbe(pParse);
              if (p != (Vdbe *)0x0) {
                pPVar6 = pParse->pToplevel;
                if (pParse->pToplevel == (Parse *)0x0) {
                  pPVar6 = pParse;
                }
                pPVar6->mayAbort = '\x01';
                pcVar8 = pTVar3->zName;
                iVar2 = sqlite3Utf8CharLen(pcVar8,-1);
                sqlite3NestedParse(pParse,
                                   "UPDATE \"%w\".sqlite_master SET sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, %d) WHERE (type!=\'index\' OR tbl_name=%Q COLLATE nocase)AND   name NOT LIKE \'sqliteX_%%\' ESCAPE \'X\'"
                                   ,pcVar9,pcVar9,pcVar8,zName,(ulong)(iDb == 1),pcVar8);
                sqlite3NestedParse(pParse,
                                   "UPDATE %Q.sqlite_master SET tbl_name = %Q, name = CASE WHEN type=\'table\' THEN %Q WHEN name LIKE \'sqliteX_autoindex%%\' ESCAPE \'X\'      AND type=\'index\' THEN \'sqlite_autoindex_\' || %Q || substr(name,%d+18) ELSE name END WHERE tbl_name=%Q COLLATE nocase AND (type=\'table\' OR type=\'index\' OR type=\'trigger\');"
                                   ,pcVar9,zName,zName,zName,CONCAT44(extraout_var,iVar2),pcVar8);
                pTVar3 = sqlite3FindTable(db,"sqlite_sequence",pcVar9);
                if (pTVar3 != (Table *)0x0) {
                  sqlite3NestedParse(pParse,
                                     "UPDATE \"%w\".sqlite_sequence set name = %Q WHERE name = %Q",
                                     pcVar9);
                }
                if (iDb != 1) {
                  sqlite3NestedParse(pParse,
                                     "UPDATE sqlite_temp_schema SET sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, 1), tbl_name = CASE WHEN tbl_name=%Q COLLATE nocase AND   sqlite_rename_test(%Q, sql, type, name, 1, \'after rename\', 0) THEN %Q ELSE tbl_name END WHERE type IN (\'view\', \'trigger\')"
                                    );
                }
                if (zP4 != (VTable *)0x0) {
                  iVar2 = pParse->nMem + 1;
                  pParse->nMem = iVar2;
                  sqlite3VdbeLoadString(p,iVar2,zName);
                  iVar2 = sqlite3VdbeAddOp3(p,0xb0,iVar2,0,0);
                  sqlite3VdbeChangeP4(p,iVar2,(char *)zP4,-0xb);
                }
                renameReloadSchema(pParse,iDb,1);
                renameTestSchema(pParse,pcVar9,(uint)(iDb == 1),"after rename",0);
              }
            }
            goto LAB_001645be;
          }
          pcVar9 = "view %s may not be altered";
        }
        else {
          pcVar9 = "there is already another table or index with this name: %s";
          pcVar8 = zName;
        }
        sqlite3ErrorMsg(pParse,pcVar9,pcVar8);
      }
    }
  }
  else {
    zName = (char *)0x0;
  }
LAB_001645be:
  sqlite3SrcListDelete(db,pSrc);
  if (zName == (char *)0x0) {
    return;
  }
  sqlite3DbFreeNN(db,zName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterRenameTable(
  Parse *pParse,            /* Parser context. */
  SrcList *pSrc,            /* The table to rename. */
  Token *pName              /* The new table name. */
){
  int iDb;                  /* Database that contains the table */
  char *zDb;                /* Name of database iDb */
  Table *pTab;              /* Table being renamed */
  char *zName = 0;          /* NULL-terminated version of pName */
  sqlite3 *db = pParse->db; /* Database connection */
  int nTabName;             /* Number of UTF-8 characters in zTabName */
  const char *zTabName;     /* Original name of the table */
  Vdbe *v;
  VTable *pVTab = 0;        /* Non-zero if this is a v-tab with an xRename() */

  if( NEVER(db->mallocFailed) ) goto exit_rename_table;
  assert( pSrc->nSrc==1 );
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );

  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_rename_table;
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  zDb = db->aDb[iDb].zDbSName;

  /* Get a NULL terminated version of the new table name. */
  zName = sqlite3NameFromToken(db, pName);
  if( !zName ) goto exit_rename_table;

  /* Check that a table or index named 'zName' does not already exist
  ** in database iDb. If so, this is an error.
  */
  if( sqlite3FindTable(db, zName, zDb)
   || sqlite3FindIndex(db, zName, zDb)
   || sqlite3IsShadowTableOf(db, pTab, zName)
  ){
    sqlite3ErrorMsg(pParse,
        "there is already another table or index with this name: %s", zName);
    goto exit_rename_table;
  }

  /* Make sure it is not a system table being altered, or a reserved name
  ** that the table is being renamed to.
  */
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ){
    goto exit_rename_table;
  }
  if( SQLITE_OK!=sqlite3CheckObjectName(pParse,zName,"table",zName) ){
    goto exit_rename_table;
  }

#ifndef SQLITE_OMIT_VIEW
  if( IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "view %s may not be altered", pTab->zName);
    goto exit_rename_table;
  }
#endif

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    goto exit_rename_table;
  }
#endif

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_rename_table;
  }
  if( IsVirtual(pTab) ){
    pVTab = sqlite3GetVTable(db, pTab);
    if( pVTab->pVtab->pModule->xRename==0 ){
      pVTab = 0;
    }
  }
#endif

  /* Begin a transaction for database iDb. Then modify the schema cookie
  ** (since the ALTER TABLE modifies the schema). Call sqlite3MayAbort(),
  ** as the scalar functions (e.g. sqlite_rename_table()) invoked by the
  ** nested SQL may raise an exception.  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto exit_rename_table;
  }
  sqlite3MayAbort(pParse);

  /* figure out how many UTF-8 characters are in zName */
  zTabName = pTab->zName;
  nTabName = sqlite3Utf8CharLen(zTabName, -1);

  /* Rewrite all CREATE TABLE, INDEX, TRIGGER or VIEW statements in
  ** the schema to use the new table name.  */
  sqlite3NestedParse(pParse,
      "UPDATE \"%w\"." LEGACY_SCHEMA_TABLE " SET "
      "sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, %d) "
      "WHERE (type!='index' OR tbl_name=%Q COLLATE nocase)"
      "AND   name NOT LIKE 'sqliteX_%%' ESCAPE 'X'"
      , zDb, zDb, zTabName, zName, (iDb==1), zTabName
  );

  /* Update the tbl_name and name columns of the sqlite_schema table
  ** as required.  */
  sqlite3NestedParse(pParse,
      "UPDATE %Q." LEGACY_SCHEMA_TABLE " SET "
          "tbl_name = %Q, "
          "name = CASE "
            "WHEN type='table' THEN %Q "
            "WHEN name LIKE 'sqliteX_autoindex%%' ESCAPE 'X' "
            "     AND type='index' THEN "
             "'sqlite_autoindex_' || %Q || substr(name,%d+18) "
            "ELSE name END "
      "WHERE tbl_name=%Q COLLATE nocase AND "
          "(type='table' OR type='index' OR type='trigger');",
      zDb,
      zName, zName, zName,
      nTabName, zTabName
  );

#ifndef SQLITE_OMIT_AUTOINCREMENT
  /* If the sqlite_sequence table exists in this database, then update
  ** it with the new table name.
  */
  if( sqlite3FindTable(db, "sqlite_sequence", zDb) ){
    sqlite3NestedParse(pParse,
        "UPDATE \"%w\".sqlite_sequence set name = %Q WHERE name = %Q",
        zDb, zName, pTab->zName);
  }
#endif

  /* If the table being renamed is not itself part of the temp database,
  ** edit view and trigger definitions within the temp database
  ** as required.  */
  if( iDb!=1 ){
    sqlite3NestedParse(pParse,
        "UPDATE sqlite_temp_schema SET "
            "sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, 1), "
            "tbl_name = "
              "CASE WHEN tbl_name=%Q COLLATE nocase AND "
              "  sqlite_rename_test(%Q, sql, type, name, 1, 'after rename', 0) "
              "THEN %Q ELSE tbl_name END "
            "WHERE type IN ('view', 'trigger')"
        , zDb, zTabName, zName, zTabName, zDb, zName);
  }

  /* If this is a virtual table, invoke the xRename() function if
  ** one is defined. The xRename() callback will modify the names
  ** of any resources used by the v-table implementation (including other
  ** SQLite tables) that are identified by the name of the virtual table.
  */
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( pVTab ){
    int i = ++pParse->nMem;
    sqlite3VdbeLoadString(v, i, zName);
    sqlite3VdbeAddOp4(v, OP_VRename, i, 0, 0,(const char*)pVTab, P4_VTAB);
  }
#endif

  renameReloadSchema(pParse, iDb, INITFLAG_AlterRename);
  renameTestSchema(pParse, zDb, iDb==1, "after rename", 0);

exit_rename_table:
  sqlite3SrcListDelete(db, pSrc);
  sqlite3DbFree(db, zName);
}